

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

unsigned_long wabt::interp::IntTruncSat<unsigned_long,float>(float val)

{
  bool bVar1;
  uint uVar2;
  unsigned_long uVar3;
  ulong uStack_10;
  float val_local;
  
  uVar2 = std::isnan((double)(ulong)(uint)val);
  if ((uVar2 & 1) == 0) {
    bVar1 = CanConvert<unsigned_long,float>((f32)val);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      uStack_10 = (long)val | (long)(val - 9.223372e+18) & (long)val >> 0x3f;
    }
    else {
      bVar1 = std::signbit(val);
      uVar3 = std::numeric_limits<unsigned_long>::min();
      uStack_10 = std::numeric_limits<unsigned_long>::max();
      if (bVar1) {
        uStack_10 = uVar3;
      }
    }
  }
  else {
    uStack_10 = 0;
  }
  return uStack_10;
}

Assistant:

R WABT_VECTORCALL IntTruncSat(T val) {
  if (WABT_UNLIKELY(std::isnan(val))) {
    return 0;
  } else if (WABT_UNLIKELY(!CanConvert<R>(val))) {
    return std::signbit(val) ? std::numeric_limits<R>::min()
                             : std::numeric_limits<R>::max();
  } else {
    return static_cast<R>(val);
  }
}